

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * comma_expression(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  token *ptVar2;
  expression *peVar3;
  char *pcVar4;
  expression *peVar5;
  expression *local_40;
  expression *local_38;
  
  local_38 = (expression *)0x0;
  ptVar2 = dmrC_assignment_expression(C,token,&local_38);
  if (local_38 == (expression *)0x0) {
    peVar3 = (expression *)0x0;
  }
  else {
    peVar3 = local_38;
    if ((((ulong)ptVar2->pos & 0x3f) == 0x11) && ((ptVar2->field_2).special == 0x2c)) {
      peVar5 = local_38;
      while( true ) {
        local_40 = (expression *)0x0;
        pVar1 = ptVar2->pos;
        peVar3 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)peVar3 = 0x15;
        peVar3->pos = pVar1;
        ptVar2 = dmrC_assignment_expression(C,ptVar2->next,&local_40);
        if (local_40 == (expression *)0x0) break;
        peVar3->field_0x1 =
             (byte)((ushort)*(undefined2 *)peVar5 >> 8) &
             (byte)((ushort)*(undefined2 *)local_40 >> 8) & 1;
        peVar3->op = 0x2c;
        (peVar3->field_5).field_3.unop = peVar5;
        (peVar3->field_5).field_2.string = (string *)local_40;
        if ((((ulong)ptVar2->pos & 0x3f) != 0x11) ||
           (peVar5 = peVar3, (ptVar2->field_2).special != 0x2c)) goto LAB_00108d74;
      }
      local_38 = peVar5;
      pcVar4 = dmrC_show_special(C,0x2c);
      dmrC_sparse_error(C,ptVar2->pos,"No right hand side of \'%s\'-expression",pcVar4);
      peVar3 = local_38;
    }
  }
LAB_00108d74:
  *tree = peVar3;
  return ptVar2;
}

Assistant:

static struct token *comma_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_COMMA, dmrC_assignment_expression,
		(op == ',')
	);
}